

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

void decSetOverflow(decNumber *dn,decContext *set,uint32_t *status)

{
  byte bVar1;
  bool bVar2;
  int local_28;
  int32_t emax;
  uint8_t sign;
  uint8_t needmax;
  uint32_t *status_local;
  decContext *set_local;
  decNumber *dn_local;
  
  bVar2 = false;
  bVar1 = dn->bits & 0x80;
  if (((dn->lsu[0] == '\0') && (dn->digits == 1)) && ((dn->bits & 0x70) == 0)) {
    local_28 = set->emax;
    if (set->clamp != '\0') {
      local_28 = local_28 - (set->digits + -1);
    }
    if (local_28 < dn->exponent) {
      dn->exponent = local_28;
      *status = *status | 0x400;
    }
  }
  else {
    uprv_decNumberZero_63(dn);
    switch(set->round) {
    case DEC_ROUND_CEILING:
      bVar2 = bVar1 != 0;
      break;
    default:
      break;
    case DEC_ROUND_DOWN:
      bVar2 = true;
      break;
    case DEC_ROUND_FLOOR:
      bVar2 = bVar1 == 0;
      break;
    case DEC_ROUND_05UP:
      bVar2 = true;
    }
    if (bVar2) {
      decSetMaxValue(dn,set);
      dn->bits = bVar1;
    }
    else {
      dn->bits = bVar1 | 0x40;
    }
    *status = *status | 0xa20;
  }
  return;
}

Assistant:

static void decSetOverflow(decNumber *dn, decContext *set, uInt *status) {
  Flag needmax=0;                  /* result is maximum finite value  */
  uByte sign=dn->bits&DECNEG;      /* clean and save sign bit  */

  if (ISZERO(dn)) {                /* zero does not overflow magnitude  */
    Int emax=set->emax;                      /* limit value  */
    if (set->clamp) emax-=set->digits-1;     /* lower if clamping  */
    if (dn->exponent>emax) {                 /* clamp required  */
      dn->exponent=emax;
      *status|=DEC_Clamped;
      }
    return;
    }

  uprv_decNumberZero(dn);
  switch (set->round) {
    case DEC_ROUND_DOWN: {
      needmax=1;                   /* never Infinity  */
      break;} /* r-d  */
    case DEC_ROUND_05UP: {
      needmax=1;                   /* never Infinity  */
      break;} /* r-05  */
    case DEC_ROUND_CEILING: {
      if (sign) needmax=1;         /* Infinity if non-negative  */
      break;} /* r-c  */
    case DEC_ROUND_FLOOR: {
      if (!sign) needmax=1;        /* Infinity if negative  */
      break;} /* r-f  */
    default: break;                /* Infinity in all other cases  */
    }
  if (needmax) {
    decSetMaxValue(dn, set);
    dn->bits=sign;                 /* set sign  */
    }
   else dn->bits=sign|DECINF;      /* Value is +/-Infinity  */
  *status|=DEC_Overflow | DEC_Inexact | DEC_Rounded;
  }